

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_>::rehash
          (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *this,size_t sizeHint
          )

{
  Entry *pEVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  ulong uVar8;
  Node<QByteArray,_QRhiGles2::PipelineCacheData> *pNVar9;
  ulong uVar10;
  size_t index;
  long lVar11;
  size_t sVar12;
  long lVar13;
  QByteArrayView QVar14;
  R RVar15;
  Bucket BVar16;
  Span *local_48;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar12 = 0x80;
  if ((0x40 < sizeHint) && (sVar12 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar11 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    sVar12 = 1L << (0x41 - ((byte)lVar11 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar15 = allocateSpans(sVar12);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = sVar12;
  if (0x7f < uVar2) {
    uVar10 = 0;
    local_48 = pSVar3;
    do {
      lVar11 = 0;
      do {
        uVar8 = (ulong)local_48->offsets[lVar11];
        if (uVar8 != 0xff) {
          pEVar4 = pSVar3[uVar10].entries;
          QVar14.m_data = *(storage_type **)(pEVar4[uVar8].storage.data + 8);
          QVar14.m_size = *(qsizetype *)(pEVar4[uVar8].storage.data + 0x10);
          sVar12 = qHash(QVar14,this->seed);
          BVar16 = findBucketWithHash<QByteArray>(this,(QByteArray *)(pEVar4 + uVar8),sVar12);
          pNVar9 = Span<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_>::insert
                             (BVar16.span,BVar16.index);
          pDVar5 = *(Data **)pEVar4[uVar8].storage.data;
          pEVar1 = pEVar4 + uVar8;
          (pEVar1->storage).data[0] = '\0';
          (pEVar1->storage).data[1] = '\0';
          (pEVar1->storage).data[2] = '\0';
          (pEVar1->storage).data[3] = '\0';
          (pEVar1->storage).data[4] = '\0';
          (pEVar1->storage).data[5] = '\0';
          (pEVar1->storage).data[6] = '\0';
          (pEVar1->storage).data[7] = '\0';
          (pNVar9->key).d.d = pDVar5;
          pcVar6 = *(char **)(pEVar4[uVar8].storage.data + 8);
          pEVar1 = pEVar4 + uVar8;
          (pEVar1->storage).data[8] = '\0';
          (pEVar1->storage).data[9] = '\0';
          (pEVar1->storage).data[10] = '\0';
          (pEVar1->storage).data[0xb] = '\0';
          (pEVar1->storage).data[0xc] = '\0';
          (pEVar1->storage).data[0xd] = '\0';
          (pEVar1->storage).data[0xe] = '\0';
          (pEVar1->storage).data[0xf] = '\0';
          (pNVar9->key).d.ptr = pcVar6;
          qVar7 = *(qsizetype *)(pEVar4[uVar8].storage.data + 0x10);
          pEVar1 = pEVar4 + uVar8;
          (pEVar1->storage).data[0x10] = '\0';
          (pEVar1->storage).data[0x11] = '\0';
          (pEVar1->storage).data[0x12] = '\0';
          (pEVar1->storage).data[0x13] = '\0';
          (pEVar1->storage).data[0x14] = '\0';
          (pEVar1->storage).data[0x15] = '\0';
          (pEVar1->storage).data[0x16] = '\0';
          (pEVar1->storage).data[0x17] = '\0';
          (pNVar9->key).d.size = qVar7;
          (pNVar9->value).format = *(quint32 *)(pEVar4[uVar8].storage.data + 0x18);
          pDVar5 = *(Data **)(pEVar4[uVar8].storage.data + 0x20);
          pEVar1 = pEVar4 + uVar8;
          (pEVar1->storage).data[0x20] = '\0';
          (pEVar1->storage).data[0x21] = '\0';
          (pEVar1->storage).data[0x22] = '\0';
          (pEVar1->storage).data[0x23] = '\0';
          (pEVar1->storage).data[0x24] = '\0';
          (pEVar1->storage).data[0x25] = '\0';
          (pEVar1->storage).data[0x26] = '\0';
          (pEVar1->storage).data[0x27] = '\0';
          (pNVar9->value).data.d.d = pDVar5;
          pcVar6 = *(char **)(pEVar4[uVar8].storage.data + 0x28);
          pEVar1 = pEVar4 + uVar8;
          (pEVar1->storage).data[0x28] = '\0';
          (pEVar1->storage).data[0x29] = '\0';
          (pEVar1->storage).data[0x2a] = '\0';
          (pEVar1->storage).data[0x2b] = '\0';
          (pEVar1->storage).data[0x2c] = '\0';
          (pEVar1->storage).data[0x2d] = '\0';
          (pEVar1->storage).data[0x2e] = '\0';
          (pEVar1->storage).data[0x2f] = '\0';
          (pNVar9->value).data.d.ptr = pcVar6;
          qVar7 = *(qsizetype *)(pEVar4[uVar8].storage.data + 0x30);
          pEVar4 = pEVar4 + uVar8;
          (pEVar4->storage).data[0x30] = '\0';
          (pEVar4->storage).data[0x31] = '\0';
          (pEVar4->storage).data[0x32] = '\0';
          (pEVar4->storage).data[0x33] = '\0';
          (pEVar4->storage).data[0x34] = '\0';
          (pEVar4->storage).data[0x35] = '\0';
          (pEVar4->storage).data[0x36] = '\0';
          (pEVar4->storage).data[0x37] = '\0';
          (pNVar9->value).data.d.size = qVar7;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x80);
      Span<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_>::freeData(pSVar3 + uVar10)
      ;
      uVar10 = uVar10 + 1;
      local_48 = local_48 + 1;
    } while (uVar10 != uVar2 >> 7);
  }
  if (pSVar3 != (Span *)0x0) {
    lVar11 = *(long *)&pSVar3[-1].allocated;
    if (lVar11 != 0) {
      lVar13 = lVar11 * 0x90;
      do {
        Span<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_>::freeData
                  ((Span<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)
                   (pSVar3[-1].offsets + lVar13));
        lVar13 = lVar13 + -0x90;
      } while (lVar13 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar11 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }